

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O1

_tPseudoDtSels * __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_pseudoDtSels<yactfr::internal::PseudoVarType>
          (_tPseudoDtSels *__return_storage_ptr__,DtFromPseudoRootDtConverter *this,
          PseudoVarType *pseudoDt)

{
  ConstPseudoDtSet pseudoSelDts;
  _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_50;
  
  if ((pseudoDt->_selLoc).super_type.m_initialized == false) {
    __assert_fail("pseudoDt.selLoc()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x33d,
                  "DtFromPseudoRootDtConverter::_tPseudoDtSels yactfr::internal::DtFromPseudoRootDtConverter::_pseudoDtSels(const PseudoDtT &) const [PseudoDtT = yactfr::internal::PseudoVarType]"
                 );
  }
  _findPseudoDts((ConstPseudoDtSet *)&local_50,this,
                 (DataLocation *)&(pseudoDt->_selLoc).super_type.m_storage,&pseudoDt->super_PseudoDt
                );
  if (local_50._M_element_count != 0) {
    if ((pseudoDt->_selLoc).super_type.m_initialized != false) {
      (__return_storage_ptr__->first)._scope =
           *(Scope *)&(pseudoDt->_selLoc).super_type.m_storage.dummy_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&(__return_storage_ptr__->first)._pathElems,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&(pseudoDt->_selLoc).super_type.m_storage.dummy_ + 8));
      std::
      _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable(&(__return_storage_ptr__->second)._M_h,&local_50,&local_50);
      std::
      _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_50);
      return __return_storage_ptr__;
    }
    __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bb,
                  "reference_const_type boost::optional<yactfr::DataLocation>::get() const [T = yactfr::DataLocation]"
                 );
  }
  __assert_fail("!pseudoSelDts.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                ,0x341,
                "DtFromPseudoRootDtConverter::_tPseudoDtSels yactfr::internal::DtFromPseudoRootDtConverter::_pseudoDtSels(const PseudoDtT &) const [PseudoDtT = yactfr::internal::PseudoVarType]"
               );
}

Assistant:

DtFromPseudoRootDtConverter::_tPseudoDtSels DtFromPseudoRootDtConverter::_pseudoDtSels(const PseudoDtT& pseudoDt) const
{
    assert(pseudoDt.selLoc());

    auto pseudoSelDts = this->_findPseudoDts(*pseudoDt.selLoc(), pseudoDt);

    assert(!pseudoSelDts.empty());
    return {*pseudoDt.selLoc(), std::move(pseudoSelDts)};
}